

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O2

bool el::base::utils::OS::termSupportsColor(void)

{
  bool bVar1;
  bool bVar2;
  char *in_RCX;
  char *in_R8;
  string term;
  string sStack_28;
  
  getEnvironmentVariable_abi_cxx11_(&sStack_28,(OS *)"TERM","",in_RCX,in_R8);
  bVar1 = ::std::operator==(&sStack_28,"xterm");
  bVar2 = true;
  if (!bVar1) {
    bVar1 = ::std::operator==(&sStack_28,"xterm-color");
    if (!bVar1) {
      bVar1 = ::std::operator==(&sStack_28,"xterm-256color");
      if (!bVar1) {
        bVar1 = ::std::operator==(&sStack_28,"screen");
        if (!bVar1) {
          bVar1 = ::std::operator==(&sStack_28,"linux");
          if (!bVar1) {
            bVar1 = ::std::operator==(&sStack_28,"cygwin");
            if (!bVar1) {
              bVar2 = ::std::operator==(&sStack_28,"screen-256color");
            }
          }
        }
      }
    }
  }
  ::std::__cxx11::string::~string((string *)&sStack_28);
  return bVar2;
}

Assistant:

bool OS::termSupportsColor(void) {
  std::string term = getEnvironmentVariable("TERM", "");
  return term == "xterm" || term == "xterm-color" || term == "xterm-256color"
         || term == "screen" || term == "linux" || term == "cygwin"
         || term == "screen-256color";
}